

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomType.cpp
# Opt level: O0

void __thiscall OpenMD::AtomType::copyAllData(AtomType *this,AtomType *orig)

{
  mapped_type_conflict mVar1;
  mapped_type_conflict1 mVar2;
  bool bVar3;
  mapped_type_conflict1 *pmVar4;
  mapped_type_conflict *pmVar5;
  long in_RSI;
  key_type *in_RDI;
  iterator it;
  vector<std::shared_ptr<OpenMD::GenericData>,_std::allocator<std::shared_ptr<OpenMD::GenericData>_>_>
  oprops;
  iterator j;
  iterator i;
  AtomType *in_stack_ffffffffffffff08;
  shared_ptr<OpenMD::GenericData> *in_stack_ffffffffffffff10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *in_stack_ffffffffffffff20;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  *in_stack_ffffffffffffff50;
  shared_ptr<OpenMD::GenericData> local_a0;
  shared_ptr<OpenMD::GenericData> *local_90;
  shared_ptr<OpenMD::GenericData> *local_88;
  __normal_iterator<std::shared_ptr<OpenMD::GenericData>_*,_std::vector<std::shared_ptr<OpenMD::GenericData>,_std::allocator<std::shared_ptr<OpenMD::GenericData>_>_>_>
  local_80;
  shared_ptr<OpenMD::GenericData> *in_stack_ffffffffffffff88;
  AtomType *in_stack_ffffffffffffff90;
  _Self local_60;
  _Base_ptr local_58;
  _Self local_50;
  _Base_ptr local_48;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
  local_40;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
  local_38;
  string local_30 [32];
  long local_10;
  
  in_RDI[1].field_2._M_local_buf[8] = *(byte *)(in_RSI + 0x38) & 1;
  *(undefined8 *)(in_RDI + 2) = *(undefined8 *)(in_RSI + 0x40);
  (in_RDI->field_2)._M_allocated_capacity = *(size_type *)(in_RSI + 0x10);
  local_10 = in_RSI;
  std::__cxx11::string::string(local_30,(string *)(in_RSI + 0x18));
  std::__cxx11::string::operator=((string *)((in_RDI->field_2)._M_local_buf + 8),local_30);
  std::__cxx11::string::~string(local_30);
  *(undefined4 *)&in_RDI->_M_string_length = *(undefined4 *)(local_10 + 8);
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
  ::_Rb_tree_iterator(&local_38);
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
  ::_Rb_tree_iterator(&local_40);
  local_48 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                      *)in_stack_ffffffffffffff08);
  local_38._M_node = local_48;
  while( true ) {
    local_50._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                *)in_stack_ffffffffffffff08);
    bVar3 = std::operator!=(&local_38,&local_50);
    if (!bVar3) break;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
    ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
                 *)0x281b0b);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ::operator[](in_stack_ffffffffffffff50,in_RDI);
    mVar2 = *pmVar4;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
    ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
                 *)0x281b3c);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ::operator[](in_stack_ffffffffffffff50,in_RDI);
    *pmVar4 = (mapped_type_conflict1)(mVar2 & 1);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
                  *)in_stack_ffffffffffffff10);
  }
  local_58 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
             ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                      *)in_stack_ffffffffffffff08);
  local_40._M_node = local_58;
  while( true ) {
    local_60._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                *)in_stack_ffffffffffffff08);
    bVar3 = std::operator!=(&local_40,&local_60);
    if (!bVar3) break;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
    ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
                 *)0x281bea);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                           *)in_stack_ffffffffffffff50,in_RDI);
    mVar1 = *pmVar5;
    in_stack_ffffffffffffff20 = &in_RDI[4].field_2;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
    ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
                 *)0x281c21);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                           *)in_stack_ffffffffffffff50,in_RDI);
    *pmVar5 = mVar1;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
                  *)in_stack_ffffffffffffff10);
  }
  getProperties(in_stack_ffffffffffffff08);
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<OpenMD::GenericData>_*,_std::vector<std::shared_ptr<OpenMD::GenericData>,_std::allocator<std::shared_ptr<OpenMD::GenericData>_>_>_>
  ::__normal_iterator(&local_80);
  local_88 = (shared_ptr<OpenMD::GenericData> *)
             std::
             vector<std::shared_ptr<OpenMD::GenericData>,_std::allocator<std::shared_ptr<OpenMD::GenericData>_>_>
             ::begin((vector<std::shared_ptr<OpenMD::GenericData>,_std::allocator<std::shared_ptr<OpenMD::GenericData>_>_>
                      *)in_stack_ffffffffffffff08);
  local_80._M_current = local_88;
  while( true ) {
    local_90 = (shared_ptr<OpenMD::GenericData> *)
               std::
               vector<std::shared_ptr<OpenMD::GenericData>,_std::allocator<std::shared_ptr<OpenMD::GenericData>_>_>
               ::end((vector<std::shared_ptr<OpenMD::GenericData>,_std::allocator<std::shared_ptr<OpenMD::GenericData>_>_>
                      *)in_stack_ffffffffffffff08);
    bVar3 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<OpenMD::GenericData>_*,_std::vector<std::shared_ptr<OpenMD::GenericData>,_std::allocator<std::shared_ptr<OpenMD::GenericData>_>_>_>
                        *)in_stack_ffffffffffffff10,
                       (__normal_iterator<std::shared_ptr<OpenMD::GenericData>_*,_std::vector<std::shared_ptr<OpenMD::GenericData>,_std::allocator<std::shared_ptr<OpenMD::GenericData>_>_>_>
                        *)in_stack_ffffffffffffff08);
    if (!bVar3) break;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<OpenMD::GenericData>_*,_std::vector<std::shared_ptr<OpenMD::GenericData>,_std::allocator<std::shared_ptr<OpenMD::GenericData>_>_>_>
    ::operator*(&local_80);
    in_stack_ffffffffffffff10 = &local_a0;
    std::shared_ptr<OpenMD::GenericData>::shared_ptr
              (in_stack_ffffffffffffff10,
               (shared_ptr<OpenMD::GenericData> *)in_stack_ffffffffffffff08);
    addProperty(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x281ce3);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<OpenMD::GenericData>_*,_std::vector<std::shared_ptr<OpenMD::GenericData>,_std::allocator<std::shared_ptr<OpenMD::GenericData>_>_>_>
    ::operator++(&local_80);
  }
  std::
  vector<std::shared_ptr<OpenMD::GenericData>,_std::allocator<std::shared_ptr<OpenMD::GenericData>_>_>
  ::~vector((vector<std::shared_ptr<OpenMD::GenericData>,_std::allocator<std::shared_ptr<OpenMD::GenericData>_>_>
             *)in_stack_ffffffffffffff20);
  return;
}

Assistant:

void AtomType::copyAllData(AtomType* orig) {
    // makes an exact replica of another atom type down to the
    // atom ID and any base attachments it may have.
    // use with caution!

    hasBase_ = orig->hasBase_;
    base_    = orig->base_;
    mass_    = orig->mass_;
    name_    = string(orig->name_);
    ident_   = orig->ident_;

    map<string, bool>::iterator i;
    ;
    map<string, RealType>::iterator j;

    for (i = orig->myResponsibilities_.begin();
         i != orig->myResponsibilities_.end(); ++i) {
      myResponsibilities_[(*i).first] = orig->myResponsibilities_[(*i).first];
    }

    for (j = orig->myValues_.begin(); j != orig->myValues_.end(); ++j) {
      myValues_[(*j).first] = orig->myValues_[(*j).first];
    }

    std::vector<std::shared_ptr<GenericData>> oprops = orig->getProperties();
    std::vector<std::shared_ptr<GenericData>>::iterator it;

    for (it = oprops.begin(); it != oprops.end(); ++it) {
      addProperty(*it);
    }
  }